

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O0

Mio_Gate_t *
Abc_AttachFind(Mio_Gate_t **ppGates,uint **puTruthGates,int nGates,uint *uTruthNode,int *Perm)

{
  int iVar1;
  int local_48;
  int iNum;
  int v;
  int i;
  uint uTruthPerm [2];
  int *Perm_local;
  uint *uTruthNode_local;
  int nGates_local;
  uint **puTruthGates_local;
  Mio_Gate_t **ppGates_local;
  
  uTruthPerm = (uint  [2])Perm;
  iVar1 = Abc_AttachCompare(puTruthGates,nGates,uTruthNode);
  if (iVar1 < 0) {
    if (s_pPerms == (char **)0x0) {
      s_pPerms = Extra_Permutations(6);
      s_nPerms = Extra_Factorial(6);
    }
    for (iNum = 0; iNum < s_nPerms; iNum = iNum + 1) {
      Abc_TruthPermute(s_pPerms[iNum],6,uTruthNode,(uint *)&v);
      iVar1 = Abc_AttachCompare(puTruthGates,nGates,(uint *)&v);
      if (-1 < iVar1) {
        for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
          *(int *)((long)uTruthPerm + (long)local_48 * 4) = (int)s_pPerms[iNum][local_48];
        }
        return ppGates[iVar1];
      }
    }
    ppGates_local = (Mio_Gate_t **)0x0;
  }
  else {
    for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
      *(int *)((long)uTruthPerm + (long)local_48 * 4) = local_48;
    }
    ppGates_local = (Mio_Gate_t **)ppGates[iVar1];
  }
  return (Mio_Gate_t *)ppGates_local;
}

Assistant:

Mio_Gate_t * Abc_AttachFind( Mio_Gate_t ** ppGates, unsigned ** puTruthGates, int nGates, unsigned * uTruthNode, int * Perm )
{
    unsigned uTruthPerm[2];
    int i, v, iNum;

    // try the gates without permutation
    if ( (iNum = Abc_AttachCompare( puTruthGates, nGates, uTruthNode )) >= 0 )
    {
        for ( v = 0; v < 6; v++ )
            Perm[v] = v;
        return ppGates[iNum];
    }
    // get permutations
    if ( s_pPerms == NULL )
    {
        s_pPerms = Extra_Permutations( 6 );
        s_nPerms = Extra_Factorial( 6 );
    }
    // try permutations
    for ( i = 0; i < s_nPerms; i++ )
    {
        Abc_TruthPermute( s_pPerms[i], 6, uTruthNode, uTruthPerm );
        if ( (iNum = Abc_AttachCompare( puTruthGates, nGates, uTruthPerm )) >= 0 )
        {
            for ( v = 0; v < 6; v++ )
                Perm[v] = (int)s_pPerms[i][v];
            return ppGates[iNum];
        }
    }
    return NULL;
}